

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O0

bool load_char_obj(DESCRIPTOR_DATA *d,char *name)

{
  __type_conflict2 _Var1;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  bool bVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  CHAR_DATA *this;
  PC_DATA *pPVar6;
  char *pcVar7;
  long lVar8;
  CProficiencies *pCVar9;
  FILE *pFVar10;
  CHAR_DATA *pCVar11;
  RACE_DATA *pRVar12;
  CClass *pCVar13;
  char *in_RSI;
  v9 *this_00;
  DESCRIPTOR_DATA *in_RDI;
  int i_1;
  char *word;
  char letter;
  int iNest;
  int returnCode;
  string buffer;
  CHAR_DATA *charg;
  int i;
  int pos;
  int stat;
  bool found;
  FILE *fp;
  CHAR_DATA *ch;
  char strsave [4608];
  FILE *in_stack_ffffffffffffec00;
  undefined1 deduct;
  char *in_stack_ffffffffffffec08;
  CHAR_DATA *in_stack_ffffffffffffec10;
  FILE *in_stack_ffffffffffffec20;
  long *plVar14;
  int *in_stack_ffffffffffffec28;
  char **in_stack_ffffffffffffec30;
  CLogger *in_stack_ffffffffffffec38;
  size_t in_stack_ffffffffffffec40;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> *__s;
  char **ppcVar15;
  int local_1394;
  FILE *in_stack_ffffffffffffec88;
  int local_1364;
  FILE *in_stack_ffffffffffffecb8;
  CHAR_DATA *in_stack_ffffffffffffecc0;
  char *local_1330;
  undefined8 local_1328;
  string local_1320 [8];
  FILE *in_stack_ffffffffffffece8;
  CHAR_DATA *in_stack_ffffffffffffecf0;
  int local_12f8;
  int local_12f4;
  int local_12f0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]>
  local_12d8 [19];
  format_args in_stack_ffffffffffffee60;
  string_view in_stack_ffffffffffffee70;
  FILE *in_stack_ffffffffffffff18;
  CHAR_DATA *in_stack_ffffffffffffff20;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> *local_c8 [3]
  ;
  undefined8 local_b0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_a8;
  char *local_a0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> *local_90;
  char *local_88;
  undefined8 uStack_80;
  string *local_78;
  char *local_70;
  char **local_68;
  char *local_60;
  char **local_58;
  char **local_50;
  char *local_48;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_38;
  undefined8 *local_30;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_28;
  undefined8 local_20;
  undefined8 *local_18;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_10;
  char *local_8;
  
  operator_new(0x340);
  this = new_char();
  pPVar6 = new_pcdata();
  this->pcdata = pPVar6;
  in_RDI->character = this;
  this->desc = in_RDI;
  this->pcdata->entering_text = false;
  pcVar7 = palloc_string((char *)in_stack_ffffffffffffec28);
  this->name = pcVar7;
  lVar8 = get_pc_id();
  this->id = lVar8;
  iVar5 = race_lookup((char *)in_stack_ffffffffffffec30);
  this->race = (short)iVar5;
  this->level = 0;
  _Var1 = std::pow<int,int>(0,0x6299a2);
  this->act[0] = (long)_Var1 | this->act[0];
  _Var1 = std::pow<int,int>(0,0x6299cc);
  this->comm[0] = (long)_Var1 | this->comm[0];
  _Var1 = std::pow<int,int>(0,0x6299f6);
  this->comm[0] = (long)_Var1 | this->comm[0];
  zero_vector(this->pcdata->trust);
  pcVar7 = palloc_string((char *)in_stack_ffffffffffffec28);
  this->prompt = pcVar7;
  for (local_12f8 = 0; local_12f8 < 0x14; local_12f8 = local_12f8 + 1) {
    this->pcdata->queue[local_12f8][0] = '\0';
  }
  this->pcdata->read_next = 0;
  this->pcdata->write_next = 0;
  this->pcdata->pending = false;
  pCVar9 = char_data::Profs(this);
  CProficiencies::SetChar(pCVar9,this);
  pCVar9 = char_data::Profs(this);
  CProficiencies::SetPATime(pCVar9,0);
  this->pcdata->confirm_delete = false;
  this->pcdata->pwd = (char *)0x0;
  pcVar7 = palloc_string((char *)in_stack_ffffffffffffec28);
  this->pcdata->bamfin = pcVar7;
  pcVar7 = palloc_string((char *)in_stack_ffffffffffffec28);
  this->pcdata->bamfout = pcVar7;
  pcVar7 = palloc_string((char *)in_stack_ffffffffffffec28);
  this->pcdata->title = pcVar7;
  this->pcdata->roll_time = current_time;
  this->pcdata->birth_date = 0x5ec;
  this->pcdata->death_time = 500;
  this->pcdata->style = 0;
  zero_vector(this->pcdata->styles);
  for (local_12f0 = 0; local_12f0 < 5; local_12f0 = local_12f0 + 1) {
    this->perm_stat[local_12f0] = 0xd;
  }
  for (local_12f0 = 0; local_12f0 < 0x15; local_12f0 = local_12f0 + 1) {
    this->pcdata->sect_time[local_12f0] = 0;
  }
  for (local_12f0 = 0; local_12f0 < 5; local_12f0 = local_12f0 + 1) {
    this->pcdata->deposited_items[local_12f0] = 0;
  }
  this->pcdata->condition[2] = 0;
  this->pcdata->condition[1] = 0;
  this->pcdata->condition[3] = 0;
  this->pcdata->condition[4] = 0;
  this->pcdata->condition[5] = 0;
  this->pcdata->security = 0;
  this->pcdata->bounty = 0;
  this->pcdata->bounty_credits = 0;
  this->bounty_timer = 0;
  this->pcdata->end_fun = (DO_FUN *)0x0;
  this->pcdata->energy_state = 0;
  this->dam_mod = 100.0;
  this->pcdata->shifted = -1;
  this->defense_mod = 0;
  this->pcdata->tribe = 0;
  this->pcdata->save_timer = 0;
  this->disrupted = false;
  this->stolen_from = false;
  this->pcdata->souls = 0;
  this->position = 0;
  this->pcdata->cabal_level = 0;
  this->pcdata->bounty_killed = 0;
  this->pcdata->paladin_path = 0;
  this->pcdata->editing_item = 0;
  for (local_12f4 = 0; local_12f4 < 100; local_12f4 = local_12f4 + 1) {
    this->pcdata->recentkills[local_12f4] = (char *)0x0;
  }
  for (local_12f4 = 0; local_12f4 < 0xd; local_12f4 = local_12f4 + 1) {
    this->pcdata->color_scheme[local_12f4] = color_event[local_12f4].default_color;
  }
  for (local_12f4 = 0; local_12f4 < 8; local_12f4 = local_12f4 + 1) {
    this->pcdata->quests[local_12f4] = 0;
  }
  bVar2 = false;
  fclose((FILE *)fpReserve);
  pcVar7 = capitalize(in_RSI);
  sprintf((char *)local_12d8,"%s%s%s","../player",pcVar7,".gz");
  this_00 = (v9 *)0x8312d5;
  pFVar10 = fopen((char *)local_12d8,"r");
  if (pFVar10 != (FILE *)0x0) {
    fclose(pFVar10);
    ppcVar15 = &local_1330;
    local_70 = "gzip -dfq {}";
    local_60 = "gzip -dfq {}";
    local_1330 = "gzip -dfq {}";
    local_68 = ppcVar15;
    local_58 = ppcVar15;
    pcVar7 = (char *)std::char_traits<char>::length((char_type *)0x62a109);
    ppcVar15[1] = pcVar7;
    local_8 = local_70;
    local_78 = local_1320;
    local_88 = local_1330;
    uStack_80 = local_1328;
    local_90 = local_12d8;
    local_50 = &local_88;
    local_a0 = local_1330;
    local_48 = local_a0;
    local_c8[0] = ::fmt::v9::
                  make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char(&)[4608]>
                            (local_90,this_00,(char (*) [4608])local_78);
    local_30 = &local_b0;
    local_38 = local_c8;
    local_20 = 0xc;
    local_b0 = 0xc;
    local_28 = local_38;
    local_18 = local_30;
    local_10 = local_38;
    local_a8 = local_38;
    ::fmt::v9::vformat_abi_cxx11_(in_stack_ffffffffffffee70,in_stack_ffffffffffffee60);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    iVar5 = system(pcVar7);
    if (iVar5 != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffec10,
                 in_stack_ffffffffffffec08);
      std::__cxx11::string::data();
      fmt_01._M_str = (char *)ppcVar15;
      fmt_01._M_len = in_stack_ffffffffffffec40;
      CLogger::Warn<char*,int&>
                (in_stack_ffffffffffffec38,fmt_01,in_stack_ffffffffffffec30,
                 in_stack_ffffffffffffec28);
    }
    std::__cxx11::string::~string(local_1320);
  }
  __s = local_12d8;
  pcVar7 = capitalize(in_RSI);
  sprintf((char *)__s,"%s/%s.plr","../player",pcVar7);
  pFVar10 = fopen((char *)local_12d8,"r");
  if (pFVar10 != (FILE *)0x0) {
    for (local_1364 = 0; local_1364 < 100; local_1364 = local_1364 + 1) {
      rgObjNest[local_1364] = (OBJ_DATA *)0x0;
    }
    bVar2 = true;
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while (cVar3 = fread_letter(in_stack_ffffffffffffec00), cVar3 == '*') {
                fread_to_eol(in_stack_ffffffffffffec00);
              }
              if (cVar3 != '#') {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_ffffffffffffec10,in_stack_ffffffffffffec08);
                fmt._M_str = (char *)in_stack_ffffffffffffec30;
                fmt._M_len = (size_t)in_stack_ffffffffffffec28;
                CLogger::Warn<>((CLogger *)in_stack_ffffffffffffec20,fmt);
                goto LAB_0062a5b3;
              }
              pCVar11 = (CHAR_DATA *)fread_word(in_stack_ffffffffffffec20);
              bVar4 = str_cmp((char *)pCVar11,"PLAYER");
              if (bVar4) break;
              fread_char(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
            }
            bVar4 = str_cmp((char *)pCVar11,"OBJECT");
            if (bVar4) break;
            fread_obj(in_stack_ffffffffffffecf0,in_stack_ffffffffffffece8);
          }
          bVar4 = str_cmp((char *)pCVar11,"O");
          if (bVar4) break;
          fread_obj(in_stack_ffffffffffffecf0,in_stack_ffffffffffffece8);
        }
        bVar4 = str_cmp((char *)pCVar11,"CHARMED");
        if (bVar4) break;
        fread_charmie(pCVar11,in_stack_ffffffffffffec88);
      }
      bVar4 = str_cmp((char *)pCVar11,"PET");
      if (bVar4) break;
      fread_pet(in_stack_ffffffffffffecc0,in_stack_ffffffffffffecb8);
    }
    bVar4 = str_cmp((char *)pCVar11,"END");
    if (bVar4) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffec10,
                 in_stack_ffffffffffffec08);
      fmt_00._M_str = (char *)in_stack_ffffffffffffec30;
      fmt_00._M_len = (size_t)in_stack_ffffffffffffec28;
      CLogger::Warn<>((CLogger *)in_stack_ffffffffffffec20,fmt_00);
    }
LAB_0062a5b3:
    fclose(pFVar10);
  }
  free_pstring((char *)in_stack_ffffffffffffec00);
  pcVar7 = palloc_string((char *)in_stack_ffffffffffffec28);
  this->true_name = pcVar7;
  free_pstring((char *)in_stack_ffffffffffffec00);
  pcVar7 = palloc_string((char *)in_stack_ffffffffffffec28);
  this->backup_true_name = pcVar7;
  fpReserve = (FILE *)fopen("/dev/null","r");
  zero_vector(this->imm_flags);
  zero_vector(this->res_flags);
  zero_vector(this->vuln_flags);
  if (bVar2 != false) {
    if (this->race == 0) {
      iVar5 = race_lookup((char *)in_stack_ffffffffffffec30);
      this->race = (short)iVar5;
    }
    this->size = pc_race_table[this->race].size;
    this->dam_type = 0x11;
    local_1394 = 0;
    while ((local_1394 < 5 &&
           (*(long *)((long)this->race * 0x88 + 0x921130 + (long)local_1394 * 8) != 0))) {
      group_add(in_stack_ffffffffffffec10,in_stack_ffffffffffffec08,
                SUB81((ulong)in_stack_ffffffffffffec00 >> 0x38,0));
      local_1394 = local_1394 + 1;
    }
    in_stack_ffffffffffffec10 = (CHAR_DATA *)this->affected_by;
    pRVar12 = race_data_lookup((int)((ulong)in_stack_ffffffffffffec10 >> 0x20));
    BITWISE_OR((long *)in_stack_ffffffffffffec10,pRVar12->aff);
    pRVar12 = race_data_lookup((int)((ulong)in_stack_ffffffffffffec10 >> 0x20));
    BITWISE_OR(this->imm_flags,pRVar12->imm);
    plVar14 = this->res_flags;
    pRVar12 = race_data_lookup((int)((ulong)in_stack_ffffffffffffec10 >> 0x20));
    BITWISE_OR(plVar14,pRVar12->res);
    plVar14 = this->vuln_flags;
    pRVar12 = race_data_lookup((int)((ulong)in_stack_ffffffffffffec10 >> 0x20));
    BITWISE_OR(plVar14,pRVar12->vuln);
    plVar14 = this->form;
    pRVar12 = race_data_lookup((int)((ulong)in_stack_ffffffffffffec10 >> 0x20));
    copy_vector(plVar14,pRVar12->form);
    plVar14 = this->parts;
    pRVar12 = race_data_lookup((int)((ulong)in_stack_ffffffffffffec10 >> 0x20));
    copy_vector(plVar14,pRVar12->parts);
  }
  BITWISE_OR(this->imm_flags,limmune_flags);
  BITWISE_OR(this->res_flags,lres_flags);
  BITWISE_OR(this->vuln_flags,lvuln_flags);
  if ((bVar2 != false) && (this->version < 2)) {
    pCVar11 = this;
    pCVar13 = char_data::Class(in_stack_ffffffffffffec10);
    deduct = (undefined1)((ulong)pCVar11 >> 0x38);
    RString::operator_cast_to_char_(&pCVar13->base_group);
    group_add(in_stack_ffffffffffffec10,in_stack_ffffffffffffec08,(bool)deduct);
    pCVar11 = this;
    pCVar13 = char_data::Class(in_stack_ffffffffffffec10);
    RString::operator_cast_to_char_(&pCVar13->default_group);
    group_add(in_stack_ffffffffffffec10,(char *)pCVar11,(bool)deduct);
    this->pcdata->learned[gsn_recall] = 0x32;
  }
  return bVar2;
}

Assistant:

bool load_char_obj(DESCRIPTOR_DATA *d, char *name)
{
	char strsave[MAX_INPUT_LENGTH];
	CHAR_DATA *ch;
	FILE *fp;
	bool found;
	int stat;
	int pos;
	int i;

	CHAR_DATA *charg = new CHAR_DATA;

	ch = new_char();
	ch->pcdata = new_pcdata();

	d->character = ch;
	ch->desc = d;
	ch->pcdata->entering_text = false;
	ch->name = palloc_string(name);
	ch->id = get_pc_id();
	ch->race = race_lookup("human");
	ch->level = 0;

	SET_BIT(ch->act, PLR_NOSUMMON);
	SET_BIT(ch->comm, COMM_COMBINE);
	SET_BIT(ch->comm, COMM_PROMPT);

	zero_vector(ch->pcdata->trust);

	ch->prompt = palloc_string("<%hhp %mm %vmv %L> ");

	for (i = 0; i < 20; i++)
	{
		ch->pcdata->queue[i][0] = '\0';
	}

	ch->pcdata->read_next = 0;
	ch->pcdata->write_next = 0;
	ch->pcdata->pending = 0;
	ch->Profs()->SetChar(ch);
	ch->Profs()->SetPATime(0);
	ch->pcdata->confirm_delete = false;
	ch->pcdata->pwd = nullptr;
	ch->pcdata->bamfin = palloc_string("");
	ch->pcdata->bamfout = palloc_string("");
	ch->pcdata->title = palloc_string("");
	ch->pcdata->roll_time = current_time;
	ch->pcdata->birth_date = 1516; // rs starts in 1515
	ch->pcdata->death_time = 500;
	ch->pcdata->style = 0;

	zero_vector(ch->pcdata->styles);

	for (stat = 0; stat < MAX_STATS; stat++)
	{
		ch->perm_stat[stat] = 13;
	}

	for (stat = 0; stat < SECT_MAX; stat++)
	{
		ch->pcdata->sect_time[stat] = 0;
	}

	for (stat = 0; stat < MAX_STORED_ITEMS; stat++)
	{
		ch->pcdata->deposited_items[stat] = 0;
	}

	ch->pcdata->condition[COND_THIRST] = 0;
	ch->pcdata->condition[COND_FULL] = 0;
	ch->pcdata->condition[COND_HUNGER] = 0;
	ch->pcdata->condition[COND_STARVING] = 0;
	ch->pcdata->condition[COND_DEHYDRATED] = 0;
	ch->pcdata->security = 0; /* OLC */
	ch->pcdata->bounty = 0;
	ch->pcdata->bounty_credits = 0;
	ch->bounty_timer = 0;
	ch->pcdata->end_fun = nullptr;
	ch->pcdata->energy_state = 0;
	ch->dam_mod = 100;
	ch->pcdata->shifted = -1;
	ch->defense_mod = 0;
	ch->pcdata->tribe = 0;
	ch->pcdata->save_timer = 0;
	ch->disrupted = false;
	ch->stolen_from = false;
	ch->pcdata->souls = 0;
	ch->position = 0;
	ch->pcdata->cabal_level = 0;
	ch->pcdata->bounty_killed = 0;
	ch->pcdata->paladin_path = 0;
	ch->pcdata->editing_item = 0;

	for (pos = 0; pos < 100; pos++)
	{
		ch->pcdata->recentkills[pos] = nullptr;
	}

	for (pos = 0; pos < MAX_EVENTS; pos++)
	{
		ch->pcdata->color_scheme[pos] = color_event[pos].default_color;
	}

	for (pos = 0; pos < MAX_QUESTS; pos++)
	{
		ch->pcdata->quests[pos] = 0;
	}

	found = false;

	fclose(fpReserve);

	/* decompress if .gz file exists */
	sprintf(strsave, "%s%s%s", RIFT_PLAYER_DIR, capitalize(name), ".gz");

	if ((fp = fopen(strsave, "r")) != nullptr)
	{
		fclose(fp);

		auto buffer = fmt::format("gzip -dfq {}", strsave);

		auto returnCode = system(buffer.c_str());
		if(returnCode != 0) // gzip returns 0 on SUCCESS, 1 on ERROR. system returns -1 on ERROR
			RS.Logger.Warn("Command [{}] failed with exit code [{}]", buffer.data(), returnCode);
	}

	sprintf(strsave, "%s/%s.plr", RIFT_PLAYER_DIR, capitalize(name));

	if ((fp = fopen(strsave, "r")) != nullptr)
	{
		int iNest;

		for (iNest = 0; iNest < MAX_NEST; iNest++)
			rgObjNest[iNest] = nullptr;

		found = true;

		for (;;)
		{
			char letter;
			char *word;

			letter = fread_letter(fp);
			if (letter == '*')
			{
				fread_to_eol(fp);
				continue;
			}

			if (letter != '#')
			{
				RS.Logger.Warn("Load_char_obj: # not found.");
				break;
			}

			word = fread_word(fp);

			if (!str_cmp(word, "PLAYER"))
			{
				fread_char(ch, fp);
			}
			else if (!str_cmp(word, "OBJECT"))
			{
				fread_obj(ch, fp);
			}
			else if (!str_cmp(word, "O"))
			{
				fread_obj(ch, fp);
			}
			else if (!str_cmp(word, "CHARMED"))
			{
				fread_charmie(ch, fp);
			}
			else if (!str_cmp(word, "PET"))
			{
				fread_pet(ch, fp);
			}
			else if (!str_cmp(word, "END"))
			{
				break;
			}
			else
			{
				RS.Logger.Warn("Load_char_obj: bad section.");
				break;
			}
		}

		fclose(fp);
	}

	free_pstring(ch->true_name);
	ch->true_name = palloc_string(name);

	free_pstring(ch->backup_true_name);
	ch->backup_true_name = palloc_string(name);

	fpReserve = fopen(NULL_FILE, "r");

	/* Morg - Valgrind fix */
	zero_vector(ch->imm_flags);
	zero_vector(ch->res_flags);
	zero_vector(ch->vuln_flags);

	/* initialize race */
	if (found)
	{
		int i;

		if (ch->race == 0)
			ch->race = race_lookup("human");

		ch->size = pc_race_table[ch->race].size;
		ch->dam_type = 17; /*punch */

		for (i = 0; i < 5; i++)
		{
			if (pc_race_table[ch->race].skills[i] == nullptr)
				break;

			group_add(ch, pc_race_table[ch->race].skills[i], false);
		}

		BITWISE_OR(ch->affected_by, race_data_lookup(ch->race)->aff);
		BITWISE_OR(ch->imm_flags, race_data_lookup(ch->race)->imm);
		BITWISE_OR(ch->res_flags, race_data_lookup(ch->race)->res);
		BITWISE_OR(ch->vuln_flags, race_data_lookup(ch->race)->vuln);

		copy_vector(ch->form, race_data_lookup(ch->race)->form);
		copy_vector(ch->parts, race_data_lookup(ch->race)->parts);
	}

	BITWISE_OR(ch->imm_flags, limmune_flags);
	BITWISE_OR(ch->res_flags, lres_flags);
	BITWISE_OR(ch->vuln_flags, lvuln_flags);

	/* RT initialize skills */

	if (found && ch->version < 2) /* need to add the new skills */
	{
		group_add(ch, ch->Class()->base_group, false);
		group_add(ch, ch->Class()->default_group, true);
		ch->pcdata->learned[gsn_recall] = 50;
	}

	return found;
}